

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_hair_mb.cpp
# Opt level: O2

void __thiscall
embree::sse2::
BVHNHairMBlurBuilderSAH<4,_embree::CurveNiMB<4>,_embree::LineMi<4>,_embree::PointMi<4>_>::build
          (BVHNHairMBlurBuilderSAH<4,_embree::CurveNiMB<4>,_embree::LineMi<4>,_embree::PointMi<4>_>
           *this)

{
  BVHN<4> *this_00;
  Scene *pSVar1;
  long lVar2;
  ulong uVar3;
  size_t sVar4;
  Set local_20c;
  Create local_20b;
  Set local_20a;
  Create local_209;
  mvector<PrimRefMB> local_208;
  double local_1e0;
  FastAllocator *local_1d8;
  anon_class_8_1_8991fb9c createLeaf;
  Scene *local_1c8;
  undefined8 uStack_1c0;
  PrimInfoMB pinfo;
  BVHNodeRecordMB4D<embree::NodeRefPtr<4>_> root;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_c8;
  long local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  Scene *pSStack_a0;
  Scene **local_98;
  FastAllocator **ppFStack_90;
  Create *local_88;
  Set *local_80;
  Create *local_78;
  Set *local_70;
  anon_class_8_1_8991fb9c *local_68;
  BuildProgressMonitorInterface *local_60;
  Scene *local_50;
  long local_48;
  Scene *local_40;
  undefined8 uStack_38;
  
  this_00 = this->bvh;
  pSVar1 = this->scene;
  sVar4 = (pSVar1->world).numMBBezierCurves + (pSVar1->world).numMBLineSegments +
          (pSVar1->world).numMBPoints;
  if (sVar4 == 0) {
    local_c8._0_8_ = 0x7f8000007f800000;
    local_c8._8_8_ = 0x7f8000007f800000;
    local_b8 = 0xff800000ff800000;
    uStack_b0 = 0xff800000ff800000;
    local_a8 = 0x7f8000007f800000;
    pSStack_a0 = (Scene *)0x7f8000007f800000;
    local_98 = (Scene **)0xff800000ff800000;
    ppFStack_90 = (FastAllocator **)0xff800000ff800000;
    BVHN<4>::set(this_00,(NodeRef)0x8,(LBBox3fa *)&local_c8.field_1,0);
  }
  else {
    std::__cxx11::to_string((string *)&root,4);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pinfo,
                   "sse2::BVH",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&root);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &local_c8.field_1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pinfo,
                   "HairMBlurBuilderSAH");
    local_1e0 = BVHN<4>::preBuild(this_00,(string *)&local_c8.field_1);
    std::__cxx11::string::~string((string *)&local_c8.field_1);
    std::__cxx11::string::~string((string *)&pinfo);
    std::__cxx11::string::~string((string *)&root);
    lVar2 = *(long *)&(this->scene->super_AccelN).field_0x188;
    local_208.alloc.device = (MemoryMonitorInterface *)(lVar2 + 0x550);
    if (lVar2 == 0) {
      local_208.alloc.device = (MemoryMonitorInterface *)0x0;
    }
    local_208.alloc.hugepages = false;
    uVar3 = sVar4 * 0x50;
    local_208.size_active = 0;
    local_208.size_alloced = 0;
    local_208.items = (PrimRefMB *)0x0;
    (**(local_208.alloc.device)->_vptr_MemoryMonitorInterface)(local_208.alloc.device,uVar3,0);
    if (uVar3 < 0x1c00000) {
      local_208.items = (PrimRefMB *)alignedMalloc(uVar3,0x10);
    }
    else {
      local_208.items = (PrimRefMB *)os_malloc(uVar3,&local_208.alloc.hugepages);
    }
    local_208.size_active = sVar4;
    local_208.size_alloced = sVar4;
    createPrimRefArrayMSMBlur
              (&pinfo,this->scene,MTY_CURVES,sVar4,&local_208,
               &(this->bvh->scene->progressInterface).super_BuildProgressMonitor,
               (BBox1f)0x3f80000000000000);
    uVar3 = (ulong)((uint)pinfo.num_time_segments & 3);
    lVar2 = uVar3 * 0x25 + 0x1e;
    if (uVar3 == 0) {
      lVar2 = 0;
    }
    FastAllocator::init_estimate
              (&this->bvh->alloc,
               (pinfo.num_time_segments >> 2) * 0xb2 + (pinfo.num_time_segments * 0xe0 >> 4) + lVar2
              );
    for (local_b8 = 0; (4UL >> local_b8 & 1) == 0; local_b8 = local_b8 + 1) {
    }
    local_68 = &createLeaf;
    local_1c8 = this->scene;
    local_98 = &local_1c8;
    uStack_1c0 = 0;
    local_1d8 = &this->bvh->alloc;
    ppFStack_90 = &local_1d8;
    local_60 = &this->bvh->scene->progressInterface;
    local_c8._0_8_ = 4;
    local_c8._8_8_ = 0x28;
    uStack_b0 = 4;
    local_a8 = 4;
    local_88 = &local_209;
    local_80 = &local_20a;
    local_78 = &local_20b;
    local_70 = &local_20c;
    lVar2 = *(long *)&(local_1c8->super_AccelN).field_0x188;
    local_48 = lVar2 + 0x550;
    if (lVar2 == 0) {
      local_48 = 0;
    }
    uStack_38 = 0;
    createLeaf.this = this;
    pSStack_a0 = local_1c8;
    local_50 = local_1c8;
    local_40 = local_1c8;
    BVHBuilderHairMSMBlur::
    BuilderT<embree::NodeRefPtr<4>,_embree::sse2::VirtualRecalculatePrimRef,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::OBBNodeMB_t<embree::NodeRefPtr<4>,_4>::Create,_embree::OBBNodeMB_t<embree::NodeRefPtr<4>,_4>::Set,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/kernels/bvh/bvh_builder_hair_mb.cpp:62:27),_embree::Scene::BuildProgressMonitorInterface>
    ::operator()(&root,(BuilderT<embree::NodeRefPtr<4>,_embree::sse2::VirtualRecalculatePrimRef,_embree::BVHN<4>::CreateAlloc,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Create,_embree::AABBNodeMB4D_t<embree::NodeRefPtr<4>,_4>::Set,_embree::OBBNodeMB_t<embree::NodeRefPtr<4>,_4>::Create,_embree::OBBNodeMB_t<embree::NodeRefPtr<4>,_4>::Set,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_kernels_bvh_bvh_builder_hair_mb_cpp:62:27),_embree::Scene::BuildProgressMonitorInterface>
                        *)&local_c8.field_1,&local_208,&pinfo);
    BVHN<4>::set(this->bvh,(NodeRef)root.ref.ptr,&root.lbounds,pinfo.num_time_segments);
    BVHN<4>::cleanup(this->bvh,(EVP_PKEY_CTX *)root.ref.ptr);
    BVHN<4>::postBuild(this->bvh,local_1e0);
    sVar4 = local_208.size_alloced;
    if (local_208.items != (PrimRefMB *)0x0) {
      if (local_208.size_alloced * 0x50 < 0x1c00000) {
        alignedFree(local_208.items);
      }
      else {
        os_free(local_208.items,local_208.size_alloced * 0x50,local_208.alloc.hugepages);
      }
    }
    if (sVar4 != 0) {
      (**(local_208.alloc.device)->_vptr_MemoryMonitorInterface)
                (local_208.alloc.device,sVar4 * -0x50,1);
    }
  }
  return;
}

Assistant:

void build() 
      {
        /* fast path for empty BVH */
        const size_t numPrimitives = scene->getNumPrimitives(Geometry::MTY_CURVES,true);
        if (numPrimitives == 0) {
          bvh->set(BVH::emptyNode,empty,0);
          return;
        }

        double t0 = bvh->preBuild(TOSTRING(isa) "::BVH" + toString(N) + "HairMBlurBuilderSAH");

        //profile(1,5,numPrimitives,[&] (ProfileTimer& timer) {

        /* create primref array */
        mvector<PrimRefMB> prims0(scene->device,numPrimitives);
        const PrimInfoMB pinfo = createPrimRefArrayMSMBlur(scene,Geometry::MTY_CURVES,numPrimitives,prims0,bvh->scene->progressInterface);

        /* estimate acceleration structure size */
        const size_t node_bytes = pinfo.num_time_segments*sizeof(typename BVH::AABBNodeMB)/(4*N);
        const size_t leaf_bytes = CurvePrimitive::bytes(pinfo.num_time_segments);
        bvh->alloc.init_estimate(node_bytes+leaf_bytes);
    
        /* settings for BVH build */
        BVHBuilderHairMSMBlur::Settings settings;
        settings.branchingFactor = N;
        settings.maxDepth = BVH::maxBuildDepthLeaf;
        settings.logBlockSize = bsf(CurvePrimitive::max_size());
        settings.minLeafSize = CurvePrimitive::max_size();
        settings.maxLeafSize = CurvePrimitive::max_size();

        /* creates a leaf node */
        auto createLeaf = [&] (const SetMB& prims, const FastAllocator::CachedAllocator& alloc) -> NodeRecordMB4D {

          if (prims.size() == 0)
            return NodeRecordMB4D(BVH::emptyNode,empty,empty);
          
          const unsigned int geomID0 = (*prims.prims)[prims.begin()].geomID();
          if (scene->get(geomID0)->getTypeMask() & Geometry::MTY_POINTS)
            return PointPrimitive::createLeafMB(bvh,prims,alloc);
          else if (scene->get(geomID0)->getCurveBasis() == Geometry::GTY_BASIS_LINEAR)
            return LinePrimitive::createLeafMB(bvh,prims,alloc);
          else
            return CurvePrimitive::createLeafMB(bvh,prims,alloc);
        };

        /* build the hierarchy */
        auto root = BVHBuilderHairMSMBlur::build<NodeRef>
          (scene, prims0, pinfo,
           VirtualRecalculatePrimRef(scene),
           typename BVH::CreateAlloc(bvh),
           typename BVH::AABBNodeMB4D::Create(),
           typename BVH::AABBNodeMB4D::Set(),
           typename BVH::OBBNodeMB::Create(),
           typename BVH::OBBNodeMB::Set(),
           createLeaf,
           bvh->scene->progressInterface,
           settings);
        
        bvh->set(root.ref,root.lbounds,pinfo.num_time_segments);
        
        //});
        
        /* clear temporary data for static geometry */
        bvh->cleanup();
        bvh->postBuild(t0);
      }